

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdatasrc.h
# Opt level: O2

int __thiscall CVmMemorySourceList::seek(CVmMemorySourceList *this,long pos,int mode)

{
  CVmMemorySourceBlock *pCVar1;
  long lVar2;
  
  if (mode != 0) {
    if (mode == 2) {
      pos = pos + this->len_;
    }
    else {
      if (mode != 1) {
        return 1;
      }
      pos = pos + this->cur_block_->ofs + this->cur_block_ofs_;
    }
  }
  if (pos < 0) {
    pos = 0;
  }
  else {
    lVar2 = this->len_;
    if (lVar2 <= pos) {
      pCVar1 = this->last_block_;
      goto LAB_00202872;
    }
  }
  lVar2 = pos;
  pCVar1 = (CVmMemorySourceBlock *)&this->first_block_;
  do {
    pCVar1 = pCVar1->nxt;
    if (pCVar1 == (CVmMemorySourceBlock *)0x0) {
      return 0;
    }
  } while ((lVar2 < pCVar1->ofs) || (pCVar1->ofs + 0x1000 <= lVar2));
LAB_00202872:
  this->cur_block_ = pCVar1;
  this->cur_block_ofs_ = lVar2 - pCVar1->ofs;
  return 0;
}

Assistant:

int seek(long pos, int mode)
    {
        /* figure the absolute position based on the mode */
        switch (mode)
        {
        case OSFSK_SET:
            /* from the beginning - use pos as given */
            break;

        case OSFSK_CUR:
            /* from the current position */
            pos += get_pos();
            break;

        case OSFSK_END:
            /* from the end */
            pos += get_size();
            break;

        default:
            /* other modes are invalid */
            return 1;
        }

        /* limit the position to the file's bounds */
        if (pos < 0)
        {
            /* at start of file */
            pos = 0;
        }
        else if (pos >= len_)
        {
            /* 
             *   At end of file.  This is a special case for setting the
             *   block pointer, because we could be positioned at the last
             *   byte of the last block, which we won't find in our scan.
             *   Explicitly set the position here.  
             */
            pos = len_;
            cur_block_ = last_block_;
            cur_block_ofs_ = pos - last_block_->ofs;

            /* we've set the block position, so skip the usual search */
            return 0;
        }

        /* find the block containing the seek offset */
        CVmMemorySourceBlock *b;
        for (b = first_block_ ; b != 0 ; b = b->nxt)
        {
            /* if the offset is within this block, we're done */
            if (pos >= b->ofs && pos < b->ofs + BlockLen)
            {
                /* set the current pointers */
                cur_block_ = b;
                cur_block_ofs_ = pos - b->ofs;

                /* stop scanning */
                break;
            }
        }

        /* success */
        return 0;
    }